

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  char cVar1;
  BaseType basetype;
  uint value;
  Variant *pVVar2;
  ulong uVar3;
  Resource *pRVar4;
  SPIRVariable *var;
  bool bVar5;
  undefined2 uVar6;
  Dim DVar7;
  bool bVar8;
  undefined1 uVar9;
  ImageFormat IVar10;
  AccessQualifier AVar11;
  TypeID TVar12;
  TypeID TVar13;
  SmallVector<bool,_8UL> *pSVar14;
  bool bVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  ID IVar19;
  long lVar20;
  key_type kVar21;
  SPIRType *pSVar22;
  mapped_type *pmVar23;
  size_type sVar24;
  undefined4 extraout_var;
  SPIRType *pSVar25;
  SPIRType *pSVar26;
  SPIRType *pSVar27;
  const_iterator cVar28;
  mapped_type *pmVar29;
  const_iterator cVar30;
  runtime_error *this_00;
  AlignedBuffer<Resource,_8UL> *pAVar31;
  ulong uVar32;
  uint *ts_1;
  string *psVar33;
  size_t sVar34;
  char *pcVar35;
  MSLConstexprSampler *pMVar36;
  SmallVector<Resource,_8UL> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  CompilerMSL *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  CompilerMSL *pCVar37;
  Resource *__i;
  long lVar38;
  Resource *pRVar39;
  TypedID<(spirv_cross::Types)0> *pTVar40;
  byte bVar41;
  uint32_t uint_ptr_type_id;
  uint32_t var_id;
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  uint32_t ptr_type_id;
  SetBindingPair pair;
  bool set_needs_buffer_sizes [8];
  bool set_needs_swizzle_buffer [8];
  SPIRType uint_type_pointer;
  SmallVector<Resource,_8UL> resources_in_set [8];
  uint local_1184;
  CompilerMSL *local_1180;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_1178;
  MSLConstexprSampler *local_1170;
  string local_1168;
  AlignedBuffer<unsigned_int,_8UL> *local_1148;
  ID local_1140;
  undefined4 uStack_113c;
  undefined1 local_1130 [16];
  undefined8 local_1120;
  SmallVector<unsigned_int,_8UL> local_1118;
  ParsedIR *local_10e0;
  uint32_t local_10d4;
  map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
  *local_10d0;
  SmallVector<bool,_8UL> *local_10c8;
  key_type local_10c0;
  _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_10b8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_10b0;
  char local_10a8 [16];
  undefined1 local_1098 [8];
  string local_1090;
  undefined8 local_1070;
  uint32_t local_1068;
  uint local_1060 [8];
  bool *local_1040;
  size_t local_1038;
  bool local_1028 [8];
  uint32_t local_1020;
  bool local_101c;
  StorageClass local_1018;
  TypedID<(spirv_cross::Types)1> *local_1010;
  size_t local_1008;
  TypedID<(spirv_cross::Types)1> local_ff8 [8];
  Parameter *local_fd8;
  size_t local_fd0;
  Parameter local_fc0 [3];
  TypeID local_f84;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_f80;
  _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_f48;
  _Base_ptr local_f40;
  string local_f38;
  string local_f18;
  SmallVector<Resource,_8UL> local_ef8 [8];
  
  bVar41 = 0;
  this->argument_buffer_ids[4] = 0;
  this->argument_buffer_ids[5] = 0;
  this->argument_buffer_ids[6] = 0;
  this->argument_buffer_ids[7] = 0;
  this->argument_buffer_ids[0] = 0;
  this->argument_buffer_ids[1] = 0;
  this->argument_buffer_ids[2] = 0;
  this->argument_buffer_ids[3] = 0;
  lVar20 = 0xec0;
  pAVar31 = &local_ef8[0].stack_storage;
  do {
    *(undefined8 *)((long)(pAVar31 + -1) + 0x1a8) = 0;
    *(undefined8 *)((long)(pAVar31 + -1) + 0x1b0) = 0;
    *(AlignedBuffer<Resource,_8UL> **)((long)(pAVar31 + -1) + 0x1a8) = pAVar31;
    *(undefined8 *)((long)(pAVar31 + -1) + 0x1b8) = 8;
    pAVar31 = (AlignedBuffer<Resource,_8UL> *)((long)(pAVar31 + 1) + 0x18);
    lVar20 = lVar20 + -0x1d8;
  } while (lVar20 != 0);
  local_1118.super_VectorView<unsigned_int>.ptr = (uint *)&local_1118.stack_storage;
  local_1118.super_VectorView<unsigned_int>.buffer_size = 0;
  local_1118.buffer_capacity = 8;
  local_10a8[8] = '\0';
  local_10a8[9] = '\0';
  local_10a8[10] = '\0';
  local_10a8[0xb] = '\0';
  local_10a8[0xc] = '\0';
  local_10a8[0xd] = '\0';
  local_10a8[0xe] = '\0';
  local_10a8[0xf] = '\0';
  local_10a8[0] = '\0';
  local_10a8[1] = '\0';
  local_10a8[2] = '\0';
  local_10a8[3] = '\0';
  local_10a8[4] = '\0';
  local_10a8[5] = '\0';
  local_10a8[6] = '\0';
  local_10a8[7] = '\0';
  local_10e0 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_10e0);
  sVar34 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_1180 = this;
  if (sVar34 == 0) {
    bVar41 = 0;
  }
  else {
    pTVar40 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_1148 = (AlignedBuffer<unsigned_int,_8UL> *)(pTVar40 + sVar34);
    local_10d0 = &this->constexpr_samplers_by_id;
    local_10b8 = &(this->inline_uniform_blocks)._M_h;
    local_10b0 = &(this->buffers_requiring_array_length)._M_h;
    local_1178 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)0x0;
    do {
      IVar19.id = pTVar40->id;
      pVVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar2[IVar19.id].type == TypeVariable) {
        kVar21 = (key_type)Variant::get<spirv_cross::SPIRVariable>(pVVar2 + IVar19.id);
        if (((((*(StorageClass *)((long)kVar21 + 0x10) <
                (StorageClassStorageBuffer|StorageClassInput)) &&
              ((0x1005U >> (*(StorageClass *)((long)kVar21 + 0x10) & 0x1f) & 1) != 0)) &&
             (bVar15 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)kVar21,false),
             !bVar15)) &&
            ((uVar16 = Compiler::get_decoration((Compiler *)this,IVar19,DecorationDescriptorSet),
             uVar16 < 8 && ((this->msl_options).argument_buffers != false)))) &&
           ((this->argument_buffer_discrete_mask >> (uVar16 & 0x1f) & 1) == 0)) {
          local_1140.id = ((ID *)((long)kVar21 + 8))->id;
          pSVar22 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)kVar21);
          if (7 < uVar16) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1098 = (undefined1  [8])&local_1090._M_string_length;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1098,"Descriptor set index is out of range.","");
            ::std::runtime_error::runtime_error(this_00,(string *)local_1098);
            *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((*(int *)&(pSVar22->super_IVariant).field_0xc - 0x11U < 2) &&
             (local_1170 = find_constexpr_sampler(this,local_1140.id),
             local_1170 != (MSLConstexprSampler *)0x0)) {
            pmVar23 = ::std::
                      map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                      ::operator[](local_10d0,&local_1140.id);
            pMVar36 = local_1170;
            for (lVar20 = 0x19; lVar20 != 0; lVar20 = lVar20 + -1) {
              pmVar23->coord = pMVar36->coord;
              pMVar36 = (MSLConstexprSampler *)((long)pMVar36 + (ulong)bVar41 * -8 + 4);
              pmVar23 = (mapped_type *)((long)pmVar23 + (ulong)bVar41 * -8 + 4);
            }
          }
          else {
            local_1170 = (MSLConstexprSampler *)0x0;
          }
          uVar17 = Compiler::get_decoration((Compiler *)this,local_1140,DecorationBinding);
          pSVar26 = pSVar22;
          if (*(int *)&(pSVar22->super_IVariant).field_0xc == 0x11) {
            CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1140.id);
            uVar32 = 1;
            local_10c8 = (SmallVector<bool,_8UL> *)CONCAT44(local_10c8._4_4_,uVar16);
            if ((local_1170 != (MSLConstexprSampler *)0x0) &&
               (local_1170->ycbcr_conversion_enable == true)) {
              uVar32 = (ulong)local_1170->planes;
            }
            if ((int)uVar32 != 0) {
              uVar17 = 0;
              do {
                pCVar37 = local_1180;
                uVar18 = get_metal_resource_index(local_1180,(SPIRVariable *)kVar21,Image,uVar17);
                pSVar26 = (SPIRType *)0x0;
                local_1098 = (undefined1  [8])kVar21;
                (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (&local_1090,pCVar37,(ulong)local_1140.id);
                local_1070 = CONCAT44(uVar18,Image);
                local_1068 = uVar17;
                SmallVector<Resource,_8UL>::push_back(local_ef8 + uVar16,(Resource *)local_1098);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
                  operator_delete(local_1090._M_dataplus._M_p);
                }
                uVar17 = uVar17 + 1;
              } while ((uint32_t)uVar32 != uVar17);
            }
            pSVar14 = local_10c8;
            this = local_1180;
            uVar16 = (uint32_t)local_10c8;
            if ((local_1170 == (MSLConstexprSampler *)0x0) && ((pSVar22->image).dim != DimBuffer)) {
              pSVar26 = (SPIRType *)0x0;
              uVar17 = get_metal_resource_index(local_1180,(SPIRVariable *)kVar21,Sampler,0);
              local_1098 = (undefined1  [8])kVar21;
              to_sampler_expression_abi_cxx11_(&local_1090,this,local_1140.id);
              local_1070 = CONCAT44(uVar17,Sampler);
              pSVar25 = (SPIRType *)(((ulong)pSVar14 & 0xffffffff) * 0x1d8);
LAB_00252535:
              local_1068 = 0;
              SmallVector<Resource,_8UL>::push_back
                        ((SmallVector<Resource,_8UL> *)
                         (local_ef8[0].stack_storage.aligned_char +
                         (long)&pSVar25[-1].member_name_cache._M_h._M_rehash_policy),
                         (Resource *)local_1098);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
                operator_delete(local_1090._M_dataplus._M_p);
              }
            }
          }
          else {
            local_1098._4_4_ = uVar17;
            local_1098._0_4_ = uVar16;
            cVar30 = ::std::
                     _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(local_10b8,(key_type *)local_1098);
            if (cVar30.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur ==
                (__node_type *)0x0) {
              if ((local_1170 == (MSLConstexprSampler *)0x0) &&
                 ((((this->msl_options).platform != iOS ||
                   (*(int *)&(pSVar22->super_IVariant).field_0xc != 0x10)) ||
                  ((pSVar22->image).sampled != 2)))) {
                CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1140.id);
                local_1098 = (undefined1  [8])kVar21;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          (&local_1090,this,(ulong)local_1140.id);
                basetype = *(BaseType *)&(pSVar22->super_IVariant).field_0xc;
                local_1070 = CONCAT44(local_1070._4_4_,basetype);
                uVar17 = get_metal_resource_index(this,(SPIRVariable *)kVar21,basetype,0);
                pSVar26 = (SPIRType *)((ulong)uVar16 * 0x1d8);
                local_1070 = CONCAT44(uVar17,(BaseType)local_1070);
                pSVar25 = pSVar26;
                goto LAB_00252535;
              }
            }
            else {
              SmallVector<unsigned_int,_8UL>::reserve
                        (&local_1118,
                         (size_t)((long)&((IVariant *)
                                         local_1118.super_VectorView<unsigned_int>.buffer_size)->
                                         _vptr_IVariant + 1));
              *(uint32_t *)
               ((char *)local_1118.super_VectorView<unsigned_int>.ptr +
               local_1118.super_VectorView<unsigned_int>.buffer_size * 4) = local_1140.id;
              pSVar26 = (SPIRType *)
                        ((long)&((IVariant *)local_1118.super_VectorView<unsigned_int>.buffer_size)
                                ->_vptr_IVariant + 1);
              local_1118.super_VectorView<unsigned_int>.buffer_size = (size_t)pSVar26;
            }
          }
          if ((this->needs_swizzle_buffer_def == true) &&
             (bVar15 = Compiler::is_sampled_image_type((Compiler *)this,pSVar22), bVar15)) {
            pcVar35 = local_10a8 + 8;
            uVar32 = (ulong)local_1178 & 0xffffffff;
          }
          else {
            sVar24 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count(local_10b0,&local_1140.id);
            uVar32 = CONCAT71((int7)((ulong)pSVar26 >> 8),1);
            pcVar35 = local_10a8;
            if (sVar24 == 0) goto LAB_0025265d;
          }
          pcVar35[uVar16] = '\x01';
          local_1178 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                       (uVar32 & 0xffffffff);
        }
      }
LAB_0025265d:
      pTVar40 = pTVar40 + 1;
    } while ((AlignedBuffer<unsigned_int,_8UL> *)pTVar40 != local_1148);
    bVar41 = (byte)local_1178;
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_1168);
  if (((bVar41 | this->needs_swizzle_buffer_def) & 1) != 0) {
    local_1168._M_dataplus._M_p._0_4_ = 0;
    this_01 = local_ef8;
    lVar20 = 0;
    do {
      cVar1 = local_10a8[lVar20 + 8];
      if ((cVar1 != '\0') || (local_10a8[lVar20] == '\x01')) {
        if (local_1168._M_dataplus._M_p._0_4_ == 0) {
          local_1168._M_dataplus._M_p._0_4_ = ParsedIR::increase_bound_by(local_10e0,1);
          uVar16 = get_uint_type_id(this);
          pSVar22 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar16);
          SPIRType::SPIRType((SPIRType *)local_1098,pSVar22);
          local_101c = true;
          local_1020 = 1;
          local_f84.id = get_uint_type_id(this);
          local_1018 = StorageClassUniform;
          Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                    ((Compiler *)this,local_1168._M_dataplus._M_p._0_4_,(SPIRType *)local_1098);
          Compiler::set_decoration
                    ((Compiler *)this,local_1168._M_dataplus._M_p._0_4_,DecorationArrayStride,4);
          local_1098 = (undefined1  [8])&PTR__SPIRType_0035b448;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_f80);
          local_fd0 = 0;
          if (local_fd8 != local_fc0) {
            free(local_fd8);
          }
          local_1008 = 0;
          if (local_1010 != local_ff8) {
            free(local_1010);
          }
          local_1038 = 0;
          if (local_1040 != local_1028) {
            free(local_1040);
          }
          local_1070 = 0;
          if ((uint *)local_1090.field_2._8_8_ != local_1060) {
            free((void *)local_1090.field_2._8_8_);
          }
        }
        if (cVar1 != '\0') {
          IVar19.id = ParsedIR::increase_bound_by(local_10e0,1);
          local_1098 = (undefined1  [8])((ulong)local_1098 & 0xffffffff00000000);
          kVar21 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)this,IVar19.id,(uint *)&local_1168,
                              (StorageClass *)local_1098);
          local_1098 = (undefined1  [8])&local_1090._M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1098,"spvSwizzleConstants","");
          Compiler::set_name((Compiler *)local_1180,IVar19,(string *)local_1098);
          if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
            operator_delete((void *)local_1098);
          }
          pCVar37 = local_1180;
          Compiler::set_decoration
                    ((Compiler *)local_1180,IVar19,DecorationDescriptorSet,(uint32_t)lVar20);
          Compiler::set_decoration((Compiler *)pCVar37,IVar19,DecorationBinding,0xfffffffe);
          local_1098 = (undefined1  [8])kVar21;
          (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_1090,pCVar37,(ulong)IVar19.id);
          local_1070 = CONCAT44(local_1070._4_4_,UInt);
          uVar16 = get_metal_resource_index(pCVar37,(SPIRVariable *)kVar21,UInt,0);
          local_1070 = CONCAT44(uVar16,(BaseType)local_1070);
          local_1068 = 0;
          SmallVector<Resource,_8UL>::push_back(this_01,(Resource *)local_1098);
          this = local_1180;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
            operator_delete(local_1090._M_dataplus._M_p);
            this = local_1180;
          }
        }
        if (local_10a8[lVar20] == '\x01') {
          IVar19.id = ParsedIR::increase_bound_by(local_10e0,1);
          local_1098 = (undefined1  [8])((ulong)local_1098 & 0xffffffff00000000);
          kVar21 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)this,IVar19.id,(uint *)&local_1168,
                              (StorageClass *)local_1098);
          local_1098 = (undefined1  [8])&local_1090._M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1098,"spvBufferSizeConstants","");
          Compiler::set_name((Compiler *)local_1180,IVar19,(string *)local_1098);
          if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
            operator_delete((void *)local_1098);
          }
          pCVar37 = local_1180;
          Compiler::set_decoration
                    ((Compiler *)local_1180,IVar19,DecorationDescriptorSet,(uint32_t)lVar20);
          Compiler::set_decoration((Compiler *)pCVar37,IVar19,DecorationBinding,0xfffffffd);
          local_1098 = (undefined1  [8])kVar21;
          (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_1090,pCVar37,(ulong)IVar19.id);
          local_1070 = CONCAT44(local_1070._4_4_,UInt);
          uVar16 = get_metal_resource_index(pCVar37,(SPIRVariable *)kVar21,UInt,0);
          local_1070 = CONCAT44(uVar16,(BaseType)local_1070);
          local_1068 = 0;
          SmallVector<Resource,_8UL>::push_back(this_01,(Resource *)local_1098);
          this = local_1180;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
            operator_delete(local_1090._M_dataplus._M_p);
            this = local_1180;
          }
        }
      }
      lVar20 = lVar20 + 1;
      this_01 = this_01 + 1;
    } while (lVar20 != 8);
  }
  pCVar37 = local_1180;
  if ((SPIRType *)local_1118.super_VectorView<unsigned_int>.buffer_size != (SPIRType *)0x0) {
    local_1148 = (AlignedBuffer<unsigned_int,_8UL> *)local_1118.super_VectorView<unsigned_int>.ptr;
    lVar20 = local_1118.super_VectorView<unsigned_int>.buffer_size << 2;
    lVar38 = 0;
    do {
      IVar19.id = *(uint32_t *)(local_1148->aligned_char + lVar38);
      kVar21 = (key_type)
               Variant::get<spirv_cross::SPIRVariable>
                         ((pCVar37->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + IVar19.id);
      uVar16 = Compiler::get_decoration((Compiler *)pCVar37,IVar19,DecorationDescriptorSet);
      CompilerGLSL::add_resource_name(&pCVar37->super_CompilerGLSL,IVar19.id);
      local_1098 = (undefined1  [8])kVar21;
      (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_1090,pCVar37,(ulong)IVar19.id);
      local_1070 = CONCAT44(local_1070._4_4_,Struct);
      uVar17 = get_metal_resource_index(pCVar37,(SPIRVariable *)kVar21,Struct,0);
      local_1070 = CONCAT44(uVar17,(BaseType)local_1070);
      local_1068 = 0;
      SmallVector<Resource,_8UL>::push_back(local_ef8 + uVar16,(Resource *)local_1098);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
        operator_delete(local_1090._M_dataplus._M_p);
      }
      lVar38 = lVar38 + 4;
    } while (lVar20 != lVar38);
  }
  local_1184 = 0;
  local_10b0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_1180->plane_name_suffix;
  local_10d0 = (map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                *)&local_1180->buffers_requiring_dynamic_offset;
  local_f40 = &(local_1180->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header.
               _M_header;
  local_f48 = &(local_1180->inline_uniform_blocks)._M_h;
  uVar32 = 0;
  pCVar37 = local_1180;
  do {
    if (local_ef8[uVar32].super_VectorView<Resource>.buffer_size != 0) {
      if (((pCVar37->msl_options).argument_buffers != true) ||
         ((1 << ((byte)uVar32 & 0x1f) & pCVar37->argument_buffer_discrete_mask) != 0)) {
        __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x350d,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
      }
      uVar16 = ParsedIR::increase_bound_by(local_10e0,3);
      local_1120 = CONCAT44(extraout_var,uVar16);
      IVar19.id = uVar16 + 1;
      local_10d4 = uVar16 + 2;
      pCVar37->argument_buffer_ids[local_1184] = uVar16;
      pSVar22 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar37,IVar19.id);
      *(undefined4 *)&(pSVar22->super_IVariant).field_0xc = 0xf;
      ts_1 = (uint *)(ulong)local_1184;
      if ((pCVar37->argument_buffer_device_storage_mask >> (local_1184 & 0x1f) & 1) == 0) {
        pSVar22->storage = StorageClassUniform;
      }
      else {
        pSVar22->storage = StorageClassStorageBuffer;
        Compiler::set_decoration
                  ((Compiler *)pCVar37,(ID)(uint32_t)local_1120,DecorationNonWritable,0);
        ts_1 = (uint *)0x0;
        Compiler::set_decoration((Compiler *)pCVar37,IVar19,DecorationBlock,0);
      }
      join<char_const(&)[23],unsigned_int&>
                ((string *)local_1098,(spirv_cross *)"spvDescriptorSetBuffer",
                 (char (*) [23])&local_1184,ts_1);
      Compiler::set_name((Compiler *)pCVar37,IVar19,(string *)local_1098);
      if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
        operator_delete((void *)local_1098);
      }
      pSVar25 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar37,local_10d4);
      (pSVar25->super_IVariant).self.id = (pSVar22->super_IVariant).self.id;
      uVar16 = pSVar22->vecsize;
      uVar17 = pSVar22->columns;
      *(undefined8 *)&(pSVar25->super_IVariant).field_0xc =
           *(undefined8 *)&(pSVar22->super_IVariant).field_0xc;
      pSVar25->vecsize = uVar16;
      pSVar25->columns = uVar17;
      pSVar26 = pSVar22;
      SmallVector<unsigned_int,_8UL>::operator=(&pSVar25->array,&pSVar22->array);
      SmallVector<bool,_8UL>::operator=(&pSVar25->array_size_literal,&pSVar22->array_size_literal);
      bVar15 = pSVar22->pointer;
      bVar5 = pSVar22->forward_pointer;
      uVar6 = *(undefined2 *)&pSVar22->field_0x7e;
      pSVar25->pointer_depth = pSVar22->pointer_depth;
      pSVar25->pointer = bVar15;
      pSVar25->forward_pointer = bVar5;
      *(undefined2 *)&pSVar25->field_0x7e = uVar6;
      pSVar25->storage = pSVar22->storage;
      local_1178 = &pSVar22->member_types;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                (&pSVar25->member_types,local_1178);
      SmallVector<unsigned_int,_8UL>::operator=
                (&pSVar25->member_type_index_redirection,&pSVar22->member_type_index_redirection);
      DVar7 = (pSVar22->image).dim;
      bVar15 = (pSVar22->image).depth;
      bVar5 = (pSVar22->image).arrayed;
      bVar8 = (pSVar22->image).ms;
      uVar9 = (pSVar22->image).field_0xb;
      uVar16 = (pSVar22->image).sampled;
      IVar10 = (pSVar22->image).format;
      AVar11 = (pSVar22->image).access;
      TVar12.id = (pSVar22->type_alias).id;
      TVar13.id = (pSVar22->parent_type).id;
      (pSVar25->image).type = (TypeID)(pSVar22->image).type.id;
      (pSVar25->image).dim = DVar7;
      (pSVar25->image).depth = bVar15;
      (pSVar25->image).arrayed = bVar5;
      (pSVar25->image).ms = bVar8;
      (pSVar25->image).field_0xb = uVar9;
      (pSVar25->image).sampled = uVar16;
      (pSVar25->image).format = IVar10;
      (pSVar25->image).access = AVar11;
      pSVar25->type_alias = (TypeID)TVar12.id;
      pSVar25->parent_type = (TypeID)TVar13.id;
      if (pSVar22 != pSVar25) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pSVar25->member_name_cache,&(pSVar26->member_name_cache)._M_h);
      }
      pSVar25->pointer = true;
      pSVar25->pointer_depth = 1;
      (pSVar25->parent_type).id = IVar19.id;
      local_1098._0_4_ = 2;
      IVar19.id = (uint32_t)local_1120;
      psVar33 = (string *)local_1098;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                ((Compiler *)pCVar37,IVar19.id,&local_10d4,(StorageClass *)local_1098);
      join<char_const(&)[17],unsigned_int&>
                ((string *)local_1098,(spirv_cross *)"spvDescriptorSet",(char (*) [17])&local_1184,
                 (uint *)psVar33);
      Compiler::set_name((Compiler *)pCVar37,IVar19,(string *)local_1098);
      if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
        operator_delete((void *)local_1098);
      }
      uVar3 = local_ef8[uVar32].super_VectorView<Resource>.buffer_size;
      if (uVar3 != 0) {
        pRVar4 = local_ef8[uVar32].super_VectorView<Resource>.ptr;
        lVar20 = 0x3f;
        if (uVar3 != 0) {
          for (; uVar3 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        ::std::
        __introsort_loop<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                  (pRVar4,pRVar4 + uVar3,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)uVar3 < 0x11) {
          ::std::
          __insertion_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                    (pRVar4,pRVar4 + uVar3);
        }
        else {
          pRVar39 = pRVar4 + 0x10;
          ::std::
          __insertion_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                    (pRVar4,pRVar39);
          lVar20 = uVar3 * 0x38 + -0x380;
          do {
            ::std::
            __unguarded_linear_insert<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Val_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                      (pRVar39);
            pRVar39 = pRVar39 + 1;
            lVar20 = lVar20 + -0x38;
          } while (lVar20 != 0);
        }
      }
      sVar34 = local_ef8[uVar32].super_VectorView<Resource>.buffer_size;
      pCVar37 = local_1180;
      if (sVar34 != 0) {
        ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(local_ef8[uVar32].super_VectorView<Resource>.ptr)->plane;
        pMVar36 = (MSLConstexprSampler *)(sVar34 * 0x38);
        local_1148 = (AlignedBuffer<unsigned_int,_8UL> *)((ulong)local_1148 & 0xffffffff00000000);
        do {
          var = (SPIRVariable *)ts[-2].field_2._M_allocated_capacity;
          local_1170 = pMVar36;
          pSVar22 = Compiler::get_variable_data_type((Compiler *)pCVar37,var);
          lVar20 = *(long *)((long)&ts[-2].field_2 + 8);
          local_f38._M_dataplus._M_p = (pointer)&local_f38.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f38,lVar20,ts[-1]._M_dataplus._M_p + lVar20);
          local_f18._M_dataplus._M_p = (pointer)&local_f18.field_2;
          psVar33 = &local_f18;
          this_02 = (CompilerMSL *)0x2f56ae;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar33,"m","");
          ensure_valid_name((string *)local_1098,this_02,&local_f38,psVar33);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f18._M_dataplus._M_p != &local_f18.field_2) {
            operator_delete(local_f18._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f38._M_dataplus._M_p != &local_f38.field_2) {
            operator_delete(local_f38._M_dataplus._M_p);
          }
          if (*(int *)&(ts->_M_dataplus)._M_p != 0) {
            join<std::__cxx11::string&,unsigned_int&>
                      (&local_1168,(spirv_cross *)local_10b0,ts,(uint *)psVar33);
            ::std::__cxx11::string::_M_append
                      (local_1098,
                       CONCAT44(local_1168._M_dataplus._M_p._4_4_,local_1168._M_dataplus._M_p._0_4_)
                      );
            if ((void *)CONCAT44(local_1168._M_dataplus._M_p._4_4_,local_1168._M_dataplus._M_p._0_4_
                                ) != (void *)((long)&local_1168 + 0x10U)) {
              operator_delete((void *)CONCAT44(local_1168._M_dataplus._M_p._4_4_,
                                               local_1168._M_dataplus._M_p._0_4_));
            }
          }
          Compiler::set_member_name
                    ((Compiler *)pCVar37,(TypeID)(pSVar26->super_IVariant).self.id,
                     (uint32_t)local_1148,(string *)local_1098);
          if ((*(int *)((long)&ts[-1].field_2 + 8) == 0x12) &&
             (*(int *)&(pSVar22->super_IVariant).field_0xc != 0x12)) {
            sVar34 = (pSVar22->array).super_VectorView<unsigned_int>.buffer_size;
            uVar16 = ParsedIR::increase_bound_by(local_10e0,2 - (sVar34 == 0));
            pSVar25 = pSVar26;
            pSVar26 = Compiler::set<spirv_cross::SPIRType>((Compiler *)pCVar37,uVar16);
            *(undefined4 *)&(pSVar26->super_IVariant).field_0xc = 0x12;
            pSVar26->storage = StorageClassUniformConstant;
            if (sVar34 == 0) {
              pSVar26 = pSVar25;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                        (local_1178,
                         (pSVar25->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                         + 1);
              sVar34 = (pSVar25->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              (pSVar25->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr[sVar34].id = uVar16;
            }
            else {
              pSVar27 = Compiler::set<spirv_cross::SPIRType>((Compiler *)local_1180,uVar16 + 1);
              (pSVar27->super_IVariant).self.id = (pSVar26->super_IVariant).self.id;
              uVar17 = pSVar26->vecsize;
              uVar18 = pSVar26->columns;
              *(undefined8 *)&(pSVar27->super_IVariant).field_0xc =
                   *(undefined8 *)&(pSVar26->super_IVariant).field_0xc;
              pSVar27->vecsize = uVar17;
              pSVar27->columns = uVar18;
              local_10b8 = (_Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)&pSVar27->array;
              SmallVector<unsigned_int,_8UL>::operator=
                        ((SmallVector<unsigned_int,_8UL> *)local_10b8,&pSVar26->array);
              local_10c8 = &pSVar27->array_size_literal;
              SmallVector<bool,_8UL>::operator=(local_10c8,&pSVar26->array_size_literal);
              bVar15 = pSVar26->pointer;
              bVar5 = pSVar26->forward_pointer;
              uVar6 = *(undefined2 *)&pSVar26->field_0x7e;
              pSVar27->pointer_depth = pSVar26->pointer_depth;
              pSVar27->pointer = bVar15;
              pSVar27->forward_pointer = bVar5;
              *(undefined2 *)&pSVar27->field_0x7e = uVar6;
              pSVar27->storage = pSVar26->storage;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                        (&pSVar27->member_types,&pSVar26->member_types);
              SmallVector<unsigned_int,_8UL>::operator=
                        (&pSVar27->member_type_index_redirection,
                         &pSVar26->member_type_index_redirection);
              DVar7 = (pSVar26->image).dim;
              bVar15 = (pSVar26->image).depth;
              bVar5 = (pSVar26->image).arrayed;
              bVar8 = (pSVar26->image).ms;
              uVar9 = (pSVar26->image).field_0xb;
              uVar17 = (pSVar26->image).sampled;
              IVar10 = (pSVar26->image).format;
              AVar11 = (pSVar26->image).access;
              TVar12.id = (pSVar26->type_alias).id;
              TVar13.id = (pSVar26->parent_type).id;
              (pSVar27->image).type = (TypeID)(pSVar26->image).type.id;
              (pSVar27->image).dim = DVar7;
              (pSVar27->image).depth = bVar15;
              (pSVar27->image).arrayed = bVar5;
              (pSVar27->image).ms = bVar8;
              (pSVar27->image).field_0xb = uVar9;
              (pSVar27->image).sampled = uVar17;
              (pSVar27->image).format = IVar10;
              (pSVar27->image).access = AVar11;
              pSVar27->type_alias = (TypeID)TVar12.id;
              pSVar27->parent_type = (TypeID)TVar13.id;
              if (pSVar26 != pSVar27) {
                ::std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)&pSVar27->member_name_cache,&(pSVar26->member_name_cache)._M_h);
              }
              SmallVector<unsigned_int,_8UL>::operator=
                        ((SmallVector<unsigned_int,_8UL> *)local_10b8,&pSVar22->array);
              SmallVector<bool,_8UL>::operator=(local_10c8,&pSVar22->array_size_literal);
              (pSVar27->parent_type).id = uVar16;
              pSVar26 = pSVar25;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                        (local_1178,
                         (pSVar25->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                         + 1);
              sVar34 = (pSVar25->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              (pSVar25->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr[sVar34].id = uVar16 + 1;
            }
            (pSVar25->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = sVar34 + 1;
            pCVar37 = local_1180;
          }
          else {
            local_10c0.binding =
                 Compiler::get_decoration
                           ((Compiler *)pCVar37,(ID)(var->super_IVariant).self.id,DecorationBinding)
            ;
            local_10c0.desc_set = local_1184;
            if (*(int *)((long)&ts[-1].field_2 + 8) - 0x10U < 3) {
              uVar16 = Compiler::get_variable_data_type_id((Compiler *)pCVar37,var);
              pSVar25 = pSVar26;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                        (local_1178,
                         (pSVar26->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                         + 1);
              sVar34 = (pSVar26->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              (pSVar26->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr[sVar34].id = uVar16;
              (pSVar26->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size = sVar34 + 1;
              pSVar26 = pSVar25;
              if (*(int *)&(ts->_M_dataplus)._M_p == 0) {
                uVar16 = (var->super_IVariant).self.id;
                (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          ((spirv_cross *)&local_1140,pCVar37,local_1120,1);
                join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                          (&local_1168,(spirv_cross *)&local_1140,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x2e3c12,(char (*) [2])local_1098,in_R8);
                Compiler::set_qualified_name((Compiler *)pCVar37,uVar16,&local_1168);
LAB_002534e5:
                if ((void *)CONCAT44(local_1168._M_dataplus._M_p._4_4_,
                                     local_1168._M_dataplus._M_p._0_4_) !=
                    (void *)((long)&local_1168 + 0x10U)) {
                  operator_delete((void *)CONCAT44(local_1168._M_dataplus._M_p._4_4_,
                                                   local_1168._M_dataplus._M_p._0_4_));
                }
                pSVar26 = pSVar25;
                if ((undefined1 *)CONCAT44(uStack_113c,local_1140.id) != local_1130) {
                  operator_delete((undefined1 *)CONCAT44(uStack_113c,local_1140.id));
                  pSVar26 = pSVar25;
                }
              }
            }
            else {
              cVar28 = ::std::
                       _Rb_tree<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                       ::find((_Rb_tree<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                               *)local_10d0,&local_10c0);
              if (cVar28._M_node == local_f40) {
                cVar30 = ::std::
                         _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(local_f48,&local_10c0);
                if (cVar30.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur ==
                    (__node_type *)0x0) {
                  pSVar25 = pSVar26;
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                            (local_1178,
                             (pSVar26->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size + 1);
                  sVar34 = (pSVar26->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size;
                  (pSVar26->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar34].id =
                       *(uint32_t *)&(var->super_IVariant).field_0xc;
                  (pSVar26->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                       sVar34 + 1;
                  uVar16 = (var->super_IVariant).self.id;
                  if ((pSVar22->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                    (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                              (&local_1140,pCVar37,local_1120,1);
                    join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                              (&local_1168,(spirv_cross *)"(*",(char (*) [3])&local_1140,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2e3c12,(char (*) [2])local_1098,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2e3e76,(char (*) [2])pSVar25);
                    Compiler::set_qualified_name((Compiler *)pCVar37,uVar16,&local_1168);
                  }
                  else {
                    (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                              ((spirv_cross *)&local_1140,pCVar37,local_1120,1);
                    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                              (&local_1168,(spirv_cross *)&local_1140,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2e3c12,(char (*) [2])local_1098,in_R8);
                    Compiler::set_qualified_name((Compiler *)pCVar37,uVar16,&local_1168);
                  }
                }
                else {
                  uVar16 = Compiler::get_variable_data_type_id((Compiler *)pCVar37,var);
                  pSVar25 = pSVar26;
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                            (local_1178,
                             (pSVar26->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size + 1);
                  sVar34 = (pSVar26->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size;
                  (pSVar26->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar34].id =
                       uVar16;
                  (pSVar26->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                       sVar34 + 1;
                  uVar16 = (var->super_IVariant).self.id;
                  (*(pCVar37->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)&local_1140,pCVar37,local_1120,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            (&local_1168,(spirv_cross *)&local_1140,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x2e3c12,(char (*) [2])local_1098,in_R8);
                  Compiler::set_qualified_name((Compiler *)pCVar37,uVar16,&local_1168);
                }
                goto LAB_002534e5;
              }
              pSVar25 = pSVar26;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                        (local_1178,
                         (pSVar26->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                         + 1);
              sVar34 = (pSVar26->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              (pSVar26->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr[sVar34].id = *(uint32_t *)&(var->super_IVariant).field_0xc;
              (pSVar26->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size = sVar34 + 1;
              uVar16 = (var->super_IVariant).self.id;
              pmVar29 = ::std::
                        map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                        ::operator[]((map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                                      *)local_10d0,&local_10c0);
              pmVar29->second = uVar16;
              pSVar26 = pSVar25;
            }
          }
          Compiler::set_extended_member_decoration
                    ((Compiler *)pCVar37,(pSVar25->super_IVariant).self.id,(uint32_t)local_1148,
                     SPIRVCrossDecorationResourceIndexPrimary,
                     *(uint32_t *)((long)&ts[-1].field_2 + 0xc));
          value = (var->super_IVariant).self.id;
          in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)value;
          Compiler::set_extended_member_decoration
                    ((Compiler *)pCVar37,(pSVar26->super_IVariant).self.id,(uint32_t)local_1148,
                     SPIRVCrossDecorationInterfaceOrigID,value);
          pMVar36 = local_1170;
          if (local_1098 != (undefined1  [8])&local_1090._M_string_length) {
            operator_delete((void *)local_1098);
          }
          ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&ts[1].field_2 + 8);
          local_1148 = (AlignedBuffer<unsigned_int,_8UL> *)
                       CONCAT44(local_1148._4_4_,(uint32_t)local_1148 + 1);
          pMVar36 = (MSLConstexprSampler *)&pMVar36[-1].max_anisotropy;
        } while (pMVar36 != (MSLConstexprSampler *)0x0);
      }
    }
    local_1184 = local_1184 + 1;
    uVar32 = (ulong)local_1184;
    if (7 < local_1184) {
      local_1118.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)local_1118.super_VectorView<unsigned_int>.ptr !=
          &local_1118.stack_storage) {
        free(local_1118.super_VectorView<unsigned_int>.ptr);
      }
      lVar20 = 0xce8;
      do {
        SmallVector<Resource,_8UL>::~SmallVector
                  ((SmallVector<Resource,_8UL> *)
                   (local_ef8[0].stack_storage.aligned_char + lVar20 + -0x18));
        lVar20 = lVar20 + -0x1d8;
      } while (lVar20 != -0x1d8);
      return;
    }
  } while( true );
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				if (!msl_options.is_ios() || type.basetype != SPIRType::Image || type.image.sampled != 2)
				{
					add_resource_name(var_id);
					resources_in_set[desc_set].push_back(
					    { &var, to_name(var_id), type.basetype, get_metal_resource_index(var, type.basetype), 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffers_requiring_array_length.count(var_id) != 0)
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth = 1;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth = 1;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);
			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else
				{
					// Resources will be declared as pointers not references, so automatically dereference as appropriate.
					buffer_type.member_types.push_back(var.basetype);
					if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}